

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_constructor.c
# Opt level: O3

int constructor_compare(constructor ctor,type_id *args,size_t size)

{
  type_id tVar1;
  int iVar2;
  ulong uVar3;
  type_conflict t;
  size_t *psVar4;
  
  iVar2 = 1;
  if ((ctor != (constructor)0x0) && (iVar2 = 1, ctor->count == size)) {
    if (size != 0) {
      psVar4 = &ctor[1].count;
      uVar3 = 0;
      do {
        if (uVar3 < ctor->count) {
          t = (type_conflict)*psVar4;
        }
        else {
          t = (type_conflict)0x0;
        }
        iVar2 = args[uVar3];
        tVar1 = type_index(t);
        if (iVar2 != tVar1) {
          return 1;
        }
        uVar3 = uVar3 + 1;
        psVar4 = psVar4 + 3;
      } while (size != uVar3);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int constructor_compare(constructor ctor, type_id args[], size_t size)
{
	size_t iterator;

	if (ctor == NULL)
	{
		return 1;
	}

	if (ctor->count != size)
	{
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		type t = constructor_get_type(ctor, iterator);

		if (args[iterator] != type_index(t))
		{
			return 1;
		}
	}

	return 0;
}